

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::_process_config_file(App *this)

{
  bool bVar1;
  Option *pOVar2;
  pointer pbVar3;
  pointer pbVar4;
  path_type pVar5;
  FileError *pFVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> config_file;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  string local_88;
  string local_68;
  string local_48;
  
  pOVar2 = this->config_ptr_;
  if (pOVar2 != (Option *)0x0) {
    bVar1 = (pOVar2->super_OptionBase<CLI::Option>).required_;
    pbVar3 = (pOVar2->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (pOVar2->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Option::as<std::__cxx11::string>(&config_file,pOVar2);
    if (config_file._M_string_length == 0) {
      if (bVar1 != false) {
        pFVar6 = (FileError *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"no specified config file",(allocator<char> *)&values);
        FileError::Missing(pFVar6,&local_48);
        __cxa_throw(pFVar6,&FileError::typeinfo,Error::~Error);
      }
    }
    else {
      pVar5 = detail::check_path(config_file._M_dataplus._M_p);
      if (pVar5 == file) {
        Config::from_file(&values,(this->config_formatter_).
                                  super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,&config_file);
        _parse_config(this,&values);
        if (pbVar3 == pbVar4) {
          pOVar2 = this->config_ptr_;
          ::std::__cxx11::string::string((string *)&local_88,(string *)&config_file);
          Option::add_result(pOVar2,&local_88);
          ::std::__cxx11::string::~string((string *)&local_88);
        }
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector(&values);
      }
      else if ((pbVar3 != pbVar4) || (bVar1 != false)) {
        pFVar6 = (FileError *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_68,(string *)&config_file);
        FileError::Missing(pFVar6,&local_68);
        __cxa_throw(pFVar6,&FileError::typeinfo,Error::~Error);
      }
    }
    ::std::__cxx11::string::~string((string *)&config_file);
  }
  return;
}

Assistant:

void _process_config_file() {
        if(config_ptr_ != nullptr) {
            bool config_required = config_ptr_->get_required();
            bool file_given = config_ptr_->count() > 0;
            auto config_file = config_ptr_->as<std::string>();
            if(config_file.empty()) {
                if(config_required) {
                    throw FileError::Missing("no specified config file");
                }
                return;
            }

            auto path_result = detail::check_path(config_file.c_str());
            if(path_result == detail::path_type::file) {
                try {
                    std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
                    _parse_config(values);
                    if(!file_given) {
                        config_ptr_->add_result(config_file);
                    }
                } catch(const FileError &) {
                    if(config_required || file_given)
                        throw;
                }
            } else if(config_required || file_given) {
                throw FileError::Missing(config_file);
            }
        }
    }